

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void hadamard_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff,int is_final)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  tran_low_t *coeff_00;
  uint uVar3;
  short sVar4;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar9 [16];
  short sVar14;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar19 [16];
  short sVar25;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 auVar31 [16];
  short sVar41;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar47 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int16_t temp_coeff [256];
  undefined4 local_260;
  short asStack_25c [62];
  short asStack_1e0 [64];
  short asStack_160 [64];
  short asStack_e0 [88];
  undefined4 uVar5;
  undefined6 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  undefined4 uVar15;
  undefined6 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [12];
  undefined1 auVar20 [16];
  undefined4 uVar26;
  undefined1 auVar32 [16];
  undefined6 uVar27;
  undefined1 auVar33 [16];
  undefined8 uVar28;
  undefined1 auVar34 [16];
  undefined1 auVar29 [12];
  undefined1 auVar35 [16];
  undefined1 auVar30 [16];
  undefined1 auVar36 [16];
  undefined4 uVar42;
  undefined1 auVar48 [16];
  undefined6 uVar43;
  undefined1 auVar49 [16];
  undefined8 uVar44;
  undefined1 auVar50 [16];
  undefined1 auVar45 [12];
  undefined1 auVar51 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  coeff_00 = &local_260;
  uVar3 = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    hadamard_8x8_sse2(src_diff + (ulong)((uint)lVar1 & 8) * src_stride + (ulong)(uVar3 & 8),
                      src_stride,coeff_00,0);
    coeff_00 = coeff_00 + 0x20;
    uVar3 = uVar3 + 8;
  }
  pauVar2 = (undefined1 (*) [16])coeff;
  for (lVar1 = 0; (uint)lVar1 < 0x40; lVar1 = lVar1 + 8) {
    sVar4 = *(short *)((long)&local_260 + lVar1 * 2);
    auVar58._0_2_ = asStack_1e0[lVar1] + sVar4;
    auVar58._2_2_ = asStack_1e0[lVar1 + 1] + asStack_25c[lVar1 + -1];
    auVar58._4_2_ = asStack_1e0[lVar1 + 2] + asStack_25c[lVar1];
    auVar58._6_2_ = asStack_1e0[lVar1 + 3] + asStack_25c[lVar1 + 1];
    auVar58._8_2_ = asStack_1e0[lVar1 + 4] + asStack_25c[lVar1 + 2];
    auVar58._10_2_ = asStack_1e0[lVar1 + 5] + asStack_25c[lVar1 + 3];
    auVar58._12_2_ = asStack_1e0[lVar1 + 6] + asStack_25c[lVar1 + 4];
    auVar58._14_2_ = asStack_1e0[lVar1 + 7] + asStack_25c[lVar1 + 5];
    auVar9._0_2_ = sVar4 - asStack_1e0[lVar1];
    auVar9._2_2_ = asStack_25c[lVar1 + -1] - asStack_1e0[lVar1 + 1];
    auVar9._4_2_ = asStack_25c[lVar1] - asStack_1e0[lVar1 + 2];
    auVar9._6_2_ = asStack_25c[lVar1 + 1] - asStack_1e0[lVar1 + 3];
    auVar9._8_2_ = asStack_25c[lVar1 + 2] - asStack_1e0[lVar1 + 4];
    auVar9._10_2_ = asStack_25c[lVar1 + 3] - asStack_1e0[lVar1 + 5];
    auVar9._12_2_ = asStack_25c[lVar1 + 4] - asStack_1e0[lVar1 + 6];
    auVar9._14_2_ = asStack_25c[lVar1 + 5] - asStack_1e0[lVar1 + 7];
    auVar65._0_2_ = asStack_e0[lVar1] + asStack_160[lVar1];
    auVar65._2_2_ = asStack_e0[lVar1 + 1] + asStack_160[lVar1 + 1];
    auVar65._4_2_ = asStack_e0[lVar1 + 2] + asStack_160[lVar1 + 2];
    auVar65._6_2_ = asStack_e0[lVar1 + 3] + asStack_160[lVar1 + 3];
    auVar65._8_2_ = asStack_e0[lVar1 + 4] + asStack_160[lVar1 + 4];
    auVar65._10_2_ = asStack_e0[lVar1 + 5] + asStack_160[lVar1 + 5];
    auVar65._12_2_ = asStack_e0[lVar1 + 6] + asStack_160[lVar1 + 6];
    auVar65._14_2_ = asStack_e0[lVar1 + 7] + asStack_160[lVar1 + 7];
    auVar57._0_2_ = asStack_160[lVar1] - asStack_e0[lVar1];
    auVar57._2_2_ = asStack_160[lVar1 + 1] - asStack_e0[lVar1 + 1];
    auVar57._4_2_ = asStack_160[lVar1 + 2] - asStack_e0[lVar1 + 2];
    auVar57._6_2_ = asStack_160[lVar1 + 3] - asStack_e0[lVar1 + 3];
    auVar57._8_2_ = asStack_160[lVar1 + 4] - asStack_e0[lVar1 + 4];
    auVar57._10_2_ = asStack_160[lVar1 + 5] - asStack_e0[lVar1 + 5];
    auVar57._12_2_ = asStack_160[lVar1 + 6] - asStack_e0[lVar1 + 6];
    auVar57._14_2_ = asStack_160[lVar1 + 7] - asStack_e0[lVar1 + 7];
    auVar19 = psraw(auVar58,1);
    auVar9 = psraw(auVar9,1);
    auVar65 = psraw(auVar65,1);
    auVar58 = psraw(auVar57,1);
    sVar41 = auVar65._0_2_ + auVar19._0_2_;
    sVar53 = auVar65._2_2_ + auVar19._2_2_;
    uVar42 = CONCAT22(sVar53,sVar41);
    sVar54 = auVar65._4_2_ + auVar19._4_2_;
    uVar43 = CONCAT24(sVar54,uVar42);
    sVar55 = auVar65._6_2_ + auVar19._6_2_;
    uVar44 = CONCAT26(sVar55,uVar43);
    sVar56 = auVar65._8_2_ + auVar19._8_2_;
    auVar45._0_10_ = CONCAT28(sVar56,uVar44);
    auVar45._10_2_ = auVar65._10_2_ + auVar19._10_2_;
    auVar46._12_2_ = auVar65._12_2_ + auVar19._12_2_;
    auVar46._0_12_ = auVar45;
    auVar46._14_2_ = auVar65._14_2_ + auVar19._14_2_;
    sVar25 = auVar58._0_2_ + auVar9._0_2_;
    sVar37 = auVar58._2_2_ + auVar9._2_2_;
    uVar26 = CONCAT22(sVar37,sVar25);
    sVar38 = auVar58._4_2_ + auVar9._4_2_;
    uVar27 = CONCAT24(sVar38,uVar26);
    sVar39 = auVar58._6_2_ + auVar9._6_2_;
    uVar28 = CONCAT26(sVar39,uVar27);
    sVar40 = auVar58._8_2_ + auVar9._8_2_;
    auVar29._0_10_ = CONCAT28(sVar40,uVar28);
    auVar29._10_2_ = auVar58._10_2_ + auVar9._10_2_;
    auVar30._12_2_ = auVar58._12_2_ + auVar9._12_2_;
    auVar30._0_12_ = auVar29;
    auVar30._14_2_ = auVar58._14_2_ + auVar9._14_2_;
    sVar14 = auVar19._0_2_ - auVar65._0_2_;
    sVar21 = auVar19._2_2_ - auVar65._2_2_;
    uVar15 = CONCAT22(sVar21,sVar14);
    sVar22 = auVar19._4_2_ - auVar65._4_2_;
    uVar16 = CONCAT24(sVar22,uVar15);
    sVar23 = auVar19._6_2_ - auVar65._6_2_;
    uVar17 = CONCAT26(sVar23,uVar16);
    sVar24 = auVar19._8_2_ - auVar65._8_2_;
    auVar18._0_10_ = CONCAT28(sVar24,uVar17);
    auVar18._10_2_ = auVar19._10_2_ - auVar65._10_2_;
    auVar20._12_2_ = auVar19._12_2_ - auVar65._12_2_;
    auVar20._0_12_ = auVar18;
    auVar20._14_2_ = auVar19._14_2_ - auVar65._14_2_;
    sVar4 = auVar9._0_2_ - auVar58._0_2_;
    sVar10 = auVar9._2_2_ - auVar58._2_2_;
    uVar5 = CONCAT22(sVar10,sVar4);
    sVar11 = auVar9._4_2_ - auVar58._4_2_;
    uVar6 = CONCAT24(sVar11,uVar5);
    sVar12 = auVar9._6_2_ - auVar58._6_2_;
    uVar7 = CONCAT26(sVar12,uVar6);
    sVar13 = auVar9._8_2_ - auVar58._8_2_;
    auVar8._0_10_ = CONCAT28(sVar13,uVar7);
    auVar8._10_2_ = auVar9._10_2_ - auVar58._10_2_;
    auVar19._12_2_ = auVar9._12_2_ - auVar58._12_2_;
    auVar19._0_12_ = auVar8;
    auVar19._14_2_ = auVar9._14_2_ - auVar58._14_2_;
    if (is_final == 0) {
      *pauVar2 = auVar46;
      pauVar2[8] = auVar30;
      pauVar2[0x10] = auVar20;
      pauVar2[0x18] = auVar19;
      pauVar2 = pauVar2 + 1;
    }
    else {
      auVar9 = psraw(auVar46,0xf);
      auVar71._12_2_ = sVar55;
      auVar71._0_12_ = auVar45;
      auVar71._14_2_ = auVar9._6_2_;
      auVar70._12_4_ = auVar71._12_4_;
      auVar70._10_2_ = auVar9._4_2_;
      auVar70._0_10_ = auVar45._0_10_;
      auVar69._10_6_ = auVar70._10_6_;
      auVar69._8_2_ = sVar54;
      auVar69._0_8_ = uVar44;
      auVar68._8_8_ = auVar69._8_8_;
      auVar68._6_2_ = auVar9._2_2_;
      auVar68._0_6_ = uVar43;
      auVar67._6_10_ = auVar68._6_10_;
      auVar67._4_2_ = sVar53;
      auVar67._0_4_ = uVar42;
      auVar66._4_12_ = auVar67._4_12_;
      auVar66._2_2_ = auVar9._0_2_;
      auVar66._0_2_ = sVar41;
      *(undefined1 (*) [16])coeff = auVar66;
      *(short *)*(undefined1 (*) [16])((long)coeff + 0x20) = sVar56;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 2) = auVar9._8_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 4) = auVar45._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 6) = auVar9._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 8) = auVar46._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 10) = auVar9._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xc) = auVar46._14_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xe) = auVar9._14_2_;
      auVar9 = psraw(auVar30,0xf);
      auVar64._12_2_ = sVar39;
      auVar64._0_12_ = auVar29;
      auVar64._14_2_ = auVar9._6_2_;
      auVar63._12_4_ = auVar64._12_4_;
      auVar63._10_2_ = auVar9._4_2_;
      auVar63._0_10_ = auVar29._0_10_;
      auVar62._10_6_ = auVar63._10_6_;
      auVar62._8_2_ = sVar38;
      auVar62._0_8_ = uVar28;
      auVar61._8_8_ = auVar62._8_8_;
      auVar61._6_2_ = auVar9._2_2_;
      auVar61._0_6_ = uVar27;
      auVar60._6_10_ = auVar61._6_10_;
      auVar60._4_2_ = sVar37;
      auVar60._0_4_ = uVar26;
      auVar59._4_12_ = auVar60._4_12_;
      auVar59._2_2_ = auVar9._0_2_;
      auVar59._0_2_ = sVar25;
      *(undefined1 (*) [16])((long)coeff + 0x100) = auVar59;
      *(short *)*(undefined1 (*) [16])((long)coeff + 0x120) = sVar40;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 2) = auVar9._8_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 4) = auVar29._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 6) = auVar9._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 8) = auVar30._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 10) = auVar9._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 0xc) = auVar30._14_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x120) + 0xe) = auVar9._14_2_;
      auVar9 = psraw(auVar20,0xf);
      auVar52._12_2_ = sVar23;
      auVar52._0_12_ = auVar18;
      auVar52._14_2_ = auVar9._6_2_;
      auVar51._12_4_ = auVar52._12_4_;
      auVar51._10_2_ = auVar9._4_2_;
      auVar51._0_10_ = auVar18._0_10_;
      auVar50._10_6_ = auVar51._10_6_;
      auVar50._8_2_ = sVar22;
      auVar50._0_8_ = uVar17;
      auVar49._8_8_ = auVar50._8_8_;
      auVar49._6_2_ = auVar9._2_2_;
      auVar49._0_6_ = uVar16;
      auVar48._6_10_ = auVar49._6_10_;
      auVar48._4_2_ = sVar21;
      auVar48._0_4_ = uVar15;
      auVar47._4_12_ = auVar48._4_12_;
      auVar47._2_2_ = auVar9._0_2_;
      auVar47._0_2_ = sVar14;
      *(undefined1 (*) [16])((long)coeff + 0x200) = auVar47;
      *(short *)*(undefined1 (*) [16])((long)coeff + 0x220) = sVar24;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 2) = auVar9._8_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 4) = auVar18._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 6) = auVar9._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 8) = auVar20._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 10) = auVar9._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 0xc) = auVar20._14_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x220) + 0xe) = auVar9._14_2_;
      auVar9 = psraw(auVar19,0xf);
      auVar36._12_2_ = sVar12;
      auVar36._0_12_ = auVar8;
      auVar36._14_2_ = auVar9._6_2_;
      auVar35._12_4_ = auVar36._12_4_;
      auVar35._10_2_ = auVar9._4_2_;
      auVar35._0_10_ = auVar8._0_10_;
      auVar34._10_6_ = auVar35._10_6_;
      auVar34._8_2_ = sVar11;
      auVar34._0_8_ = uVar7;
      auVar33._8_8_ = auVar34._8_8_;
      auVar33._6_2_ = auVar9._2_2_;
      auVar33._0_6_ = uVar6;
      auVar32._6_10_ = auVar33._6_10_;
      auVar32._4_2_ = sVar10;
      auVar32._0_4_ = uVar5;
      auVar31._4_12_ = auVar32._4_12_;
      auVar31._2_2_ = auVar9._0_2_;
      auVar31._0_2_ = sVar4;
      *(undefined1 (*) [16])((long)coeff + 0x300) = auVar31;
      *(short *)*(undefined1 (*) [16])((long)coeff + 800) = sVar13;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 2) = auVar9._8_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 4) = auVar8._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 6) = auVar9._10_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 8) = auVar19._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 10) = auVar9._12_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 0xc) = auVar19._14_2_;
      *(short *)((long)*(undefined1 (*) [16])((long)coeff + 800) + 0xe) = auVar9._14_2_;
      coeff = (tran_low_t *)((long)coeff + 0x10);
    }
    coeff = (tran_low_t *)((long)*(undefined1 (*) [16])coeff + (ulong)((uint)lVar1 & 8) * 4);
  }
  return;
}

Assistant:

static inline void hadamard_16x16_sse2(const int16_t *src_diff,
                                       ptrdiff_t src_stride, tran_low_t *coeff,
                                       int is_final) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[16 * 16]);
  int16_t *t_coeff = temp_coeff;
  int16_t *coeff16 = (int16_t *)coeff;
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    hadamard_8x8_sse2(src_ptr, src_stride, (tran_low_t *)(t_coeff + idx * 64),
                      0);
  }

  for (idx = 0; idx < 64; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 64));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 128));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 192));

    __m128i b0 = _mm_add_epi16(coeff0, coeff1);
    __m128i b1 = _mm_sub_epi16(coeff0, coeff1);
    __m128i b2 = _mm_add_epi16(coeff2, coeff3);
    __m128i b3 = _mm_sub_epi16(coeff2, coeff3);

    b0 = _mm_srai_epi16(b0, 1);
    b1 = _mm_srai_epi16(b1, 1);
    b2 = _mm_srai_epi16(b2, 1);
    b3 = _mm_srai_epi16(b3, 1);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);

    if (is_final) {
      store_tran_low_offset_4(coeff0, coeff);
      store_tran_low_offset_4(coeff1, coeff + 64);
      store_tran_low_offset_4(coeff2, coeff + 128);
      store_tran_low_offset_4(coeff3, coeff + 192);
      coeff += 4;
    } else {
      _mm_store_si128((__m128i *)coeff16, coeff0);
      _mm_store_si128((__m128i *)(coeff16 + 64), coeff1);
      _mm_store_si128((__m128i *)(coeff16 + 128), coeff2);
      _mm_store_si128((__m128i *)(coeff16 + 192), coeff3);
      coeff16 += 8;
    }

    t_coeff += 8;
    // Increment the pointer additionally by 0 and 8 in alternate
    // iterations(instead of 8) to ensure the coherency with the implementation
    // of store_tran_low_offset_4()
    coeff += (((idx >> 3) & 1) << 3);
  }
}